

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O2

void __thiscall
test_matrix_sparse_operator_subscript_Test::TestBody
          (test_matrix_sparse_operator_subscript_Test *this)

{
  initializer_list<double> value;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  DeathTest *pDVar3;
  bool bVar4;
  int iVar5;
  Scalar *pSVar6;
  char *pcVar7;
  _func_int **pp_Var8;
  DeathTest *pDVar9;
  initializer_list<unsigned_long> index;
  initializer_list<unsigned_long> non_zero;
  ReturnSentinel gtest_sentinel;
  DeathTest *gtest_dt;
  ulong uStack_140;
  AssertionResult gtest_ar_2;
  pointer local_110;
  Matrix_Sparse matrix_1;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_a0;
  size_t local_88;
  Matrix_Sparse matrix_0;
  
  matrix_1.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  matrix_1.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x1;
  matrix_1.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x2;
  gtest_ar_2 = (AssertionResult)(ZEXT816(1) << 0x40);
  gtest_dt = (DeathTest *)0x3ff0000000000000;
  uStack_140 = 0x4000000000000000;
  value._M_len = 2;
  value._M_array = (iterator)&gtest_dt;
  index._M_len = 2;
  index._M_array = (iterator)&gtest_ar_2;
  non_zero._M_len = 3;
  non_zero._M_array = (iterator)&matrix_1;
  Disa::Matrix_Sparse::Matrix_Sparse(&matrix_0,non_zero,index,value,2);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uStack_140;
  _gtest_dt = (Matrix_Sparse_Row<const_Disa::Matrix_Sparse>)(auVar2 << 0x40);
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)&gtest_ar_2,(size_t *)&matrix_0);
  gtest_sentinel.test_ = (DeathTest *)0x0;
  pSVar6 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)&gtest_ar_2,
                      (size_t *)&gtest_sentinel);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&matrix_1,"matrix_0[0][0]","1.0",*pSVar6,1.0);
  if ((char)matrix_1.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (matrix_1.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (char *)*matrix_1.row_non_zero.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x62,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if (gtest_ar_2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&matrix_1.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  gtest_dt = (DeathTest *)0x1;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)&gtest_ar_2,(size_t *)&matrix_0);
  gtest_sentinel.test_ = (DeathTest *)0x1;
  pSVar6 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)&gtest_ar_2,
                      (size_t *)&gtest_sentinel);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&matrix_1,"matrix_0[1][1]","2.0",*pSVar6,2.0);
  if ((char)matrix_1.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (matrix_1.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (char *)*matrix_1.row_non_zero.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,99,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if (gtest_ar_2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&matrix_1.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = gtest_ar_2.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
  gtest_ar_2 = (AssertionResult)(auVar1 << 0x40);
  Disa::Matrix_Sparse::operator[](&matrix_1,(size_t *)&matrix_0);
  gtest_dt = (DeathTest *)0x1;
  pSVar6 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)&matrix_1,(size_t *)&gtest_dt);
  *pSVar6 = (Scalar)&DAT_4008000000000000;
  Disa::Matrix_Sparse::Matrix_Sparse(&matrix_1,&matrix_0);
  gtest_sentinel.test_ = (DeathTest *)0x0;
  _gtest_dt = Disa::Matrix_Sparse::operator[](&matrix_1,(size_t *)&gtest_sentinel);
  local_110 = (pointer)0x0;
  pSVar6 = Disa::Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::operator[]
                     ((Matrix_Sparse_Row<const_Disa::Matrix_Sparse> *)&gtest_dt,(size_t *)&local_110
                     );
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar_2,"matrix_1[0][0]","1.0",*pSVar6,1.0);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_dt);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x67,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)&gtest_dt)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if (gtest_dt != (DeathTest *)0x0) {
      (*gtest_dt->_vptr_DeathTest[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  gtest_sentinel.test_ = (DeathTest *)0x0;
  _gtest_dt = Disa::Matrix_Sparse::operator[](&matrix_1,(size_t *)&gtest_sentinel);
  local_110 = (pointer)0x1;
  pSVar6 = Disa::Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::operator[]
                     ((Matrix_Sparse_Row<const_Disa::Matrix_Sparse> *)&gtest_dt,(size_t *)&local_110
                     );
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar_2,"matrix_1[0][1]","3.0",*pSVar6,3.0);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_dt);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x68,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)&gtest_dt)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if (gtest_dt != (DeathTest *)0x0) {
      (*gtest_dt->_vptr_DeathTest[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  gtest_sentinel.test_ = (DeathTest *)0x1;
  _gtest_dt = Disa::Matrix_Sparse::operator[](&matrix_1,(size_t *)&gtest_sentinel);
  local_110 = (pointer)0x1;
  pSVar6 = Disa::Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::operator[]
                     ((Matrix_Sparse_Row<const_Disa::Matrix_Sparse> *)&gtest_dt,(size_t *)&local_110
                     );
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar_2,"matrix_1[1][1]","2.0",*pSVar6,2.0);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_dt);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x69,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)&gtest_dt)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if (gtest_dt != (DeathTest *)0x0) {
      (*gtest_dt->_vptr_DeathTest[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_((char *)gtest_sentinel.test_);
    bVar4 = testing::internal::DeathTest::Create
                      ("matrix_1[1][0]",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_a0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x6c,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_a0);
    if (!bVar4) goto LAB_00110e80;
    pDVar9 = gtest_dt;
    if (gtest_dt == (DeathTest *)0x0) goto LAB_00110ed2;
    iVar5 = (*gtest_dt->_vptr_DeathTest[2])(gtest_dt);
    pDVar3 = gtest_dt;
    if (iVar5 == 0) {
      iVar5 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
      bVar4 = testing::internal::ExitedUnsuccessfully(iVar5);
      iVar5 = (*pDVar3->_vptr_DeathTest[4])(pDVar3,(ulong)bVar4);
      if ((char)iVar5 == '\0') {
        (*pDVar9->_vptr_DeathTest[1])(pDVar9);
        goto LAB_00110e80;
      }
    }
    else if (iVar5 == 1) {
      gtest_sentinel.test_ = gtest_dt;
      bVar4 = testing::internal::AlwaysTrue();
      if (bVar4) {
        local_110 = (pointer)0x1;
        gtest_ar_2 = (AssertionResult)
                     Disa::Matrix_Sparse::operator[](&matrix_1,(size_t *)&local_110);
        local_88 = 0;
        Disa::Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::operator[]
                  ((Matrix_Sparse_Row<const_Disa::Matrix_Sparse> *)&gtest_ar_2,&local_88);
      }
      (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
      testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
    }
    pp_Var8 = pDVar9->_vptr_DeathTest;
  }
  else {
LAB_00110e80:
    testing::Message::Message((Message *)&gtest_ar_2);
    pcVar7 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x6c,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if (gtest_ar_2._0_8_ == 0) goto LAB_00110ed2;
    pp_Var8 = *(_func_int ***)gtest_ar_2._0_8_;
    pDVar9 = (DeathTest *)gtest_ar_2._0_8_;
  }
  (*pp_Var8[1])(pDVar9);
LAB_00110ed2:
  Disa::Matrix_Sparse::~Matrix_Sparse(&matrix_1);
  Disa::Matrix_Sparse::~Matrix_Sparse(&matrix_0);
  return;
}

Assistant:

TEST(test_matrix_sparse, operator_subscript) {
  Matrix_Sparse matrix_0({0, 1, 2}, {0, 1}, {1.0, 2.0}, 2);

  EXPECT_DOUBLE_EQ(matrix_0[0][0], 1.0);
  EXPECT_DOUBLE_EQ(matrix_0[1][1], 2.0);
  matrix_0[0][1] = 3.0;  // this should insert a new element.

  const Matrix_Sparse matrix_1 = matrix_0;
  EXPECT_DOUBLE_EQ(matrix_1[0][0], 1.0);
  EXPECT_DOUBLE_EQ(matrix_1[0][1], 3.0);
  EXPECT_DOUBLE_EQ(matrix_1[1][1], 2.0);

  // Check debug for const matrix.
  EXPECT_DEATH(matrix_1[1][0], "./*");
}